

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iothubtransportmqtt.c
# Opt level: O0

XIO_HANDLE
getIoTransportProvider
          (char *fully_qualified_name,MQTT_TRANSPORT_PROXY_OPTIONS *mqtt_transport_proxy_options)

{
  IO_INTERFACE_DESCRIPTION *io_interface_description_00;
  char *local_58;
  TLSIO_CONFIG tls_io_config;
  LOGGER_LOG l;
  IO_INTERFACE_DESCRIPTION *io_interface_description;
  XIO_HANDLE result;
  MQTT_TRANSPORT_PROXY_OPTIONS *mqtt_transport_proxy_options_local;
  char *fully_qualified_name_local;
  
  io_interface_description_00 = platform_get_default_tlsio();
  if (io_interface_description_00 == (IO_INTERFACE_DESCRIPTION *)0x0) {
    tls_io_config._32_8_ = xlogging_get_log_function();
    if ((LOGGER_LOG)tls_io_config._32_8_ != (LOGGER_LOG)0x0) {
      (*(code *)tls_io_config._32_8_)
                (AZ_LOG_ERROR,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransportmqtt.c"
                 ,"getIoTransportProvider",0x15,1,"Failure constructing the provider interface");
    }
    io_interface_description = (IO_INTERFACE_DESCRIPTION *)0x0;
  }
  else {
    tls_io_config.hostname._0_4_ = 0x22b3;
    tls_io_config.port = 0;
    tls_io_config._12_4_ = 0;
    tls_io_config.underlying_io_interface = (IO_INTERFACE_DESCRIPTION *)0x0;
    local_58 = fully_qualified_name;
    io_interface_description =
         (IO_INTERFACE_DESCRIPTION *)xio_create(io_interface_description_00,&local_58);
  }
  return (XIO_HANDLE)io_interface_description;
}

Assistant:

static XIO_HANDLE getIoTransportProvider(const char* fully_qualified_name, const MQTT_TRANSPORT_PROXY_OPTIONS* mqtt_transport_proxy_options)
{
    XIO_HANDLE result;

    const IO_INTERFACE_DESCRIPTION* io_interface_description = platform_get_default_tlsio();
    (void)mqtt_transport_proxy_options;

    if (io_interface_description == NULL)
    {
        LogError("Failure constructing the provider interface");
        result = NULL;
    }
    else
    {
        TLSIO_CONFIG tls_io_config;

        tls_io_config.hostname = fully_qualified_name;
        tls_io_config.port = 8883;
        tls_io_config.underlying_io_interface = NULL;
        tls_io_config.underlying_io_parameters = NULL;

        result = xio_create(io_interface_description, &tls_io_config);
    }
    return result;
}